

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O3

bool __thiscall
iDynTree::AttitudeQuaternionEKF::setMeasurementNoiseVariance
          (AttitudeQuaternionEKF *this,double acc,double mag)

{
  bool bVar1;
  pointer peVar2;
  MatrixDynSize R;
  Span<double,__1L> R_span;
  MatrixDynSize aMStack_48 [40];
  Span<double,__1L> local_20;
  
  (this->m_params_qekf).accelerometer_noise_variance = acc;
  (this->m_params_qekf).magnetometer_noise_variance = mag;
  iDynTree::MatrixDynSize::MatrixDynSize(aMStack_48,this->m_output_size,this->m_output_size);
  prepareMeasurementNoiseCovarianceMatrix(this,aMStack_48);
  peVar2 = (pointer)iDynTree::MatrixDynSize::data();
  local_20.storage_.super_extent_type<_1L>.size_ = iDynTree::MatrixDynSize::capacity();
  local_20.storage_.data_ = peVar2;
  bVar1 = DiscreteExtendedKalmanFilterHelper::ekfSetMeasurementNoiseCovariance
                    (&this->super_DiscreteExtendedKalmanFilterHelper,&local_20);
  iDynTree::MatrixDynSize::~MatrixDynSize(aMStack_48);
  return bVar1;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::setMeasurementNoiseVariance(double acc, double mag)
{
    m_params_qekf.accelerometer_noise_variance = acc;
    m_params_qekf.magnetometer_noise_variance = mag;

    iDynTree::MatrixDynSize R = iDynTree::MatrixDynSize(m_output_size, m_output_size);
    prepareMeasurementNoiseCovarianceMatrix(R);

    iDynTree::Span<double> R_span(R.data(), R.capacity());
    bool ok = ekfSetMeasurementNoiseCovariance(R_span);
    return ok;
}